

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O2

int CfdVerifyMessage(void *handle,char *signature,char *pubkey,char *message,char *magic,
                    char **recovered_pubkey)

{
  bool bVar1;
  bool bVar2;
  size_t sVar3;
  char *pcVar4;
  CfdException *pCVar5;
  int iVar6;
  undefined1 local_c0 [38];
  allocator local_9a;
  allocator local_99;
  string local_98;
  Pubkey recoverable_pubkey;
  ByteData signature_obj;
  Pubkey pubkey_obj;
  
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(signature);
  if (bVar1) {
    local_c0._0_8_ = "cfdcapi_key.cpp";
    local_c0._8_4_ = 0x6b1;
    local_c0._16_8_ = "CfdVerifyMessage";
    cfd::core::logger::warn<>((CfdSourceLocation *)local_c0,"signature is null or empty.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)local_c0,"Failed to parameter. signature is null or empty.",
               (allocator *)&local_98);
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_c0);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(pubkey);
  if (!bVar1) {
    bVar1 = cfd::capi::IsEmptyString(message);
    if (!bVar1) {
      std::__cxx11::string::string((string *)local_c0,pubkey,(allocator *)&local_98);
      cfd::core::Pubkey::Pubkey(&pubkey_obj,(string *)local_c0);
      std::__cxx11::string::~string((string *)local_c0);
      cfd::core::ByteData::ByteData(&signature_obj);
      sVar3 = strnlen(signature,0x84);
      if (sVar3 == 0x82) {
        std::__cxx11::string::string((string *)local_c0,signature,(allocator *)&recoverable_pubkey);
        cfd::core::ByteData::ByteData((ByteData *)&local_98,(string *)local_c0);
        cfd::core::ByteData::operator=(&signature_obj,(ByteData *)&local_98);
      }
      else {
        std::__cxx11::string::string((string *)local_c0,signature,(allocator *)&recoverable_pubkey);
        cfd::core::CryptoUtil::DecodeBase64((ByteData *)&local_98,(string *)local_c0);
        cfd::core::ByteData::operator=(&signature_obj,(ByteData *)&local_98);
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_98);
      std::__cxx11::string::~string((string *)local_c0);
      cfd::core::Pubkey::Pubkey(&recoverable_pubkey);
      bVar1 = cfd::capi::IsEmptyString(magic);
      if (bVar1) {
        std::__cxx11::string::string((string *)local_c0,message,(allocator *)&local_98);
        bVar1 = cfd::core::Pubkey::VerifyBitcoinMessage
                          (&pubkey_obj,&signature_obj,(string *)local_c0,&recoverable_pubkey);
      }
      else {
        std::__cxx11::string::string((string *)local_c0,message,&local_99);
        std::__cxx11::string::string((string *)&local_98,magic,&local_9a);
        bVar1 = cfd::core::Pubkey::VerifyMessage
                          (&pubkey_obj,&signature_obj,(string *)local_c0,&local_98,
                           &recoverable_pubkey);
        std::__cxx11::string::~string((string *)&local_98);
      }
      std::__cxx11::string::~string((string *)local_c0);
      if (recovered_pubkey != (char **)0x0) {
        bVar2 = cfd::core::Pubkey::IsValid(&recoverable_pubkey);
        if (bVar2) {
          cfd::core::Pubkey::GetHex_abi_cxx11_((string *)local_c0,&recoverable_pubkey);
          pcVar4 = cfd::capi::CreateString((string *)local_c0);
          *recovered_pubkey = pcVar4;
          std::__cxx11::string::~string((string *)local_c0);
        }
      }
      iVar6 = 7;
      if (bVar1 != false) {
        iVar6 = 0;
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&recoverable_pubkey)
      ;
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&signature_obj);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey_obj);
      return iVar6;
    }
    local_c0._0_8_ = "cfdcapi_key.cpp";
    local_c0._8_4_ = 0x6bd;
    local_c0._16_8_ = "CfdVerifyMessage";
    cfd::core::logger::warn<>((CfdSourceLocation *)local_c0,"message is null or empty.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)local_c0,"Failed to parameter. message is null or empty.",
               (allocator *)&local_98);
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_c0);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_c0._0_8_ = "cfdcapi_key.cpp";
  local_c0._8_4_ = 0x6b7;
  local_c0._16_8_ = "CfdVerifyMessage";
  cfd::core::logger::warn<>((CfdSourceLocation *)local_c0,"pubkey is null or empty.");
  pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)local_c0,"Failed to parameter. pubkey is null or empty.",
             (allocator *)&local_98);
  cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_c0);
  __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdVerifyMessage(
    void* handle, const char* signature, const char* pubkey,
    const char* message, const char* magic, char** recovered_pubkey) {
  try {
    cfd::Initialize();
    if (IsEmptyString(signature)) {
      warn(CFD_LOG_SOURCE, "signature is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. signature is null or empty.");
    }
    if (IsEmptyString(pubkey)) {
      warn(CFD_LOG_SOURCE, "pubkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null or empty.");
    }
    if (IsEmptyString(message)) {
      warn(CFD_LOG_SOURCE, "message is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. message is null or empty.");
    }
    Pubkey pubkey_obj(pubkey);
    ByteData signature_obj;
    if (strnlen(signature, 132) == 130) {
      signature_obj = ByteData(signature);
    } else {
      signature_obj = CryptoUtil::DecodeBase64(signature);
    }

    Pubkey recoverable_pubkey;
    bool is_success = false;
    if (IsEmptyString(magic)) {
      is_success = pubkey_obj.VerifyBitcoinMessage(
          signature_obj, message, &recoverable_pubkey);
    } else {
      is_success = pubkey_obj.VerifyMessage(
          signature_obj, message, magic, &recoverable_pubkey);
    }
    if ((recovered_pubkey != nullptr) && recoverable_pubkey.IsValid()) {
      *recovered_pubkey = CreateString(recoverable_pubkey.GetHex());
    }

    if (!is_success) return CfdErrorCode::kCfdSignVerificationError;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}